

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<6,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar1;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar2;
  Type in0;
  Vector<float,_3> VStack_88;
  Mat3 local_7c;
  VecAccess<float,_4,_3> local_58;
  Matrix<float,_3,_3> local_3c;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,9>
              (&local_7c,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    uVar1 = extraout_EDX;
    uVar2 = extraout_var;
  }
  else {
    tcu::Matrix<float,_3,_3>::Matrix(&local_7c,(float *)sr::(anonymous_namespace)::s_constInMat3x3);
    uVar1 = extraout_EDX_00;
    uVar2 = extraout_var_00;
  }
  tcu::transpose<float,3,3>(&local_3c,(tcu *)&local_7c,(Matrix<float,_3,_3> *)CONCAT44(uVar2,uVar1))
  ;
  reduceToVec3((MatrixCaseUtils *)&VStack_88,&local_3c);
  local_58.m_vector = &evalCtx->color;
  local_58.m_index[0] = 0;
  local_58.m_index[1] = 1;
  local_58.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_58,&VStack_88);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}